

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNet.cpp
# Opt level: O0

istream * PyreNet::operator>>(istream *is,NeuralNet *nn)

{
  bool bVar1;
  vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_> *pvVar2;
  reference l_00;
  Layer *l;
  iterator __end1;
  iterator __begin1;
  vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_> *__range1;
  Layer local_40;
  int local_1c;
  NeuralNet *pNStack_18;
  int layerSize;
  NeuralNet *nn_local;
  istream *is_local;
  
  pNStack_18 = nn;
  nn_local = (NeuralNet *)is;
  std::istream::operator>>(is,&nn->inputSize);
  std::istream::operator>>(nn_local,&local_1c);
  pvVar2 = &pNStack_18->layers;
  Layer::Layer(&local_40,0,0,(Activation *)0x0);
  std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::resize
            (pvVar2,(long)local_1c,&local_40);
  Layer::~Layer(&local_40);
  pvVar2 = &pNStack_18->layers;
  __end1 = std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::begin(pvVar2);
  l = (Layer *)std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<PyreNet::Layer_*,_std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>_>
                                *)&l);
    if (!bVar1) break;
    l_00 = __gnu_cxx::
           __normal_iterator<PyreNet::Layer_*,_std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>_>
           ::operator*(&__end1);
    operator>>((istream *)nn_local,l_00);
    __gnu_cxx::
    __normal_iterator<PyreNet::Layer_*,_std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>_>
    ::operator++(&__end1);
  }
  return (istream *)nn_local;
}

Assistant:

std::istream& operator>>(std::istream& is, NeuralNet& nn) {
        is >> nn.inputSize;
        int layerSize;
        is >> layerSize;
        nn.layers.resize(layerSize, Layer(0, 0, nullptr));
        for (Layer& l : nn.layers)
            is >> l;
        return is;
    }